

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

uint32_t __thiscall jrtplib::RTPSession::GetLocalSSRC(RTPSession *this)

{
  uint32_t ssrc;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = RTPPacketBuilder::GetSSRC(&this->packetbuilder);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t RTPSession::GetLocalSSRC()
{
	if (!created)
		return 0;
	
	uint32_t ssrc;

	BUILDER_LOCK
	ssrc = packetbuilder.GetSSRC();
	BUILDER_UNLOCK
	return ssrc;
}